

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

SetEntry * raviX_set_next_entry(Set *set,SetEntry *entry)

{
  SetEntry *pSVar1;
  SetEntry *pSVar2;
  
  if (entry == (SetEntry *)0x0) {
    pSVar1 = set->table;
    pSVar2 = pSVar1;
  }
  else {
    pSVar1 = entry + 1;
    pSVar2 = set->table;
  }
  while( true ) {
    if (pSVar1 == pSVar2 + set->size) {
      return (SetEntry *)0x0;
    }
    if ((uint32_t *)pSVar1->key != (uint32_t *)0x0 && (uint32_t *)pSVar1->key != &deleted_key_value)
    break;
    pSVar1 = pSVar1 + 1;
  }
  return pSVar1;
}

Assistant:

SetEntry *raviX_set_next_entry(Set *set, SetEntry *entry)
{
	if (entry == NULL)
		entry = set->table;
	else
		entry = entry + 1;

	for (; entry != set->table + set->size; entry++) {
		if (entry_is_present(entry)) {
			return entry;
		}
	}

	return NULL;
}